

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CGL::Application::Application(Application *this,AppConfig *config,bool gl)

{
  bool direct_hemisphere_sample;
  size_t ns_aa;
  size_t max_ray_depth;
  size_t ns_area_light;
  size_t ns_diff;
  size_t ns_glsy;
  size_t ns_refr;
  size_t num_threads;
  size_t samples_per_batch;
  HDRImageBuffer *envmap;
  string filename;
  string aperture_filename;
  string ghost_aperture_filename;
  RaytracedRenderer *this_00;
  undefined1 auVar1 [12];
  undefined1 auVar3 [12];
  undefined1 auVar2 [32];
  undefined8 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  float max_tolerance;
  string *psVar4;
  OSDText *this_01;
  double flare_radius;
  double flare_intensity;
  double focalDistance;
  double lensRadius;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  (this->super_Renderer)._vptr_Renderer = (_func_int **)&PTR__Application_0029f7a8;
  Camera::Camera(&this->camera);
  Camera::Camera(&this->canonicalCamera);
  auVar2 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])&(this->defaultStyle).vertexColor.g = auVar2;
  auVar1 = auVar2._0_12_;
  auVar3 = auVar2._12_12_;
  (this->defaultStyle).halfedgeColor.r = (float)auVar1._0_4_;
  (this->defaultStyle).halfedgeColor.g = (float)auVar1._4_4_;
  (this->defaultStyle).halfedgeColor.b = (float)auVar1._8_4_;
  (this->defaultStyle).vertexColor.r = (float)auVar3._0_4_;
  (this->defaultStyle).vertexColor.g = (float)auVar3._4_4_;
  (this->defaultStyle).vertexColor.b = (float)auVar3._8_4_;
  (this->defaultStyle).edgeColor.r = (float)auVar2._24_4_;
  (this->defaultStyle).edgeColor.g = (float)auVar2._28_4_;
  auVar2 = ZEXT1632(ZEXT816(0) << 0x40);
  auVar1 = auVar2._0_12_;
  auVar3 = auVar2._12_12_;
  (this->hoverStyle).halfedgeColor.r = (float)auVar1._0_4_;
  (this->hoverStyle).halfedgeColor.g = (float)auVar1._4_4_;
  (this->hoverStyle).halfedgeColor.b = (float)auVar1._8_4_;
  (this->hoverStyle).vertexColor.r = (float)auVar3._0_4_;
  (this->hoverStyle).vertexColor.g = (float)auVar3._4_4_;
  (this->hoverStyle).vertexColor.b = (float)auVar3._8_4_;
  (this->hoverStyle).edgeColor.r = (float)auVar2._24_4_;
  (this->hoverStyle).edgeColor.g = (float)auVar2._28_4_;
  *(undefined1 (*) [32])&(this->hoverStyle).vertexColor.g = auVar2;
  auVar1 = auVar2._0_12_;
  auVar3 = auVar2._12_12_;
  (this->selectStyle).halfedgeColor.r = (float)auVar1._0_4_;
  (this->selectStyle).halfedgeColor.g = (float)auVar1._4_4_;
  (this->selectStyle).halfedgeColor.b = (float)auVar1._8_4_;
  (this->selectStyle).vertexColor.r = (float)auVar3._0_4_;
  (this->selectStyle).vertexColor.g = (float)auVar3._4_4_;
  (this->selectStyle).vertexColor.b = (float)auVar3._8_4_;
  (this->selectStyle).edgeColor.r = (float)auVar2._24_4_;
  (this->selectStyle).edgeColor.g = (float)auVar2._28_4_;
  *(undefined1 (*) [32])&(this->selectStyle).vertexColor.g = auVar2;
  this_01 = &this->textManager;
  OSDText::OSDText(this_01);
  (this->text_color).r = 0.0;
  (this->text_color).g = 0.0;
  (this->text_color).b = 0.0;
  (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  psVar4 = (string *)&this->filename;
  (this->filename).field_2._M_local_buf[0] = '\0';
  this->gl_window = gl;
  this_00 = (RaytracedRenderer *)operator_new(0x2a0);
  ns_aa = config->pathtracer_ns_aa;
  max_ray_depth = config->pathtracer_max_ray_depth;
  ns_area_light = config->pathtracer_ns_area_light;
  ns_diff = config->pathtracer_ns_diff;
  ns_glsy = config->pathtracer_ns_glsy;
  ns_refr = config->pathtracer_ns_refr;
  num_threads = config->pathtracer_num_threads;
  samples_per_batch = config->pathtracer_samples_per_patch;
  max_tolerance = config->pathtracer_max_tolerance;
  envmap = config->pathtracer_envmap;
  direct_hemisphere_sample = config->pathtracer_direct_hemisphere_sample;
  std::__cxx11::string::string(local_70,(string *)&config->pathtracer_filename);
  lensRadius = config->pathtracer_lensRadius;
  focalDistance = config->pathtracer_focalDistance;
  std::__cxx11::string::string(local_90,(string *)&config->aperture_filename);
  flare_intensity = config->pathtracer_lens_flare_intensity;
  flare_radius = config->pathtracer_lens_flare_radius;
  std::__cxx11::string::string(local_50,(string *)&config->ghost_aperture_filename);
  filename._M_string_length = (size_type)local_90;
  filename._M_dataplus._M_p = (pointer)local_70;
  filename.field_2._M_allocated_capacity = (size_type)local_50;
  filename.field_2._8_8_ = in_stack_fffffffffffffee8;
  aperture_filename._M_dataplus._M_p._4_4_ = max_tolerance;
  aperture_filename._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffef0;
  aperture_filename._M_string_length = (size_type)this_00;
  aperture_filename.field_2._M_allocated_capacity = (size_type)psVar4;
  aperture_filename.field_2._8_8_ = this_01;
  ghost_aperture_filename._M_string_length = (size_type)flare_intensity;
  ghost_aperture_filename._M_dataplus._M_p = (pointer)flare_radius;
  ghost_aperture_filename.field_2._M_allocated_capacity = (size_type)focalDistance;
  ghost_aperture_filename.field_2._8_8_ = lensRadius;
  RaytracedRenderer::RaytracedRenderer
            (this_00,ns_aa,max_ray_depth,ns_area_light,ns_diff,ns_glsy,ns_refr,num_threads,
             samples_per_batch,max_tolerance,envmap,direct_hemisphere_sample,filename,lensRadius,
             focalDistance,aperture_filename,flare_radius,flare_intensity,ghost_aperture_filename);
  this->renderer = &this_00->super_OfflineRenderer;
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::_M_assign(psVar4);
  return;
}

Assistant:

Application::Application(AppConfig config, bool gl) {
  gl_window = gl;
  renderer = new RaytracedRenderer (
    config.pathtracer_ns_aa,
    config.pathtracer_max_ray_depth,
    config.pathtracer_ns_area_light,
    config.pathtracer_ns_diff,
    config.pathtracer_ns_glsy,
    config.pathtracer_ns_refr,
    config.pathtracer_num_threads,
    config.pathtracer_samples_per_patch,
    config.pathtracer_max_tolerance,
    config.pathtracer_envmap,
    config.pathtracer_direct_hemisphere_sample,
    config.pathtracer_filename,
    config.pathtracer_lensRadius,
    config.pathtracer_focalDistance,
    config.aperture_filename,
    config.pathtracer_lens_flare_radius,
    config.pathtracer_lens_flare_intensity,
		config.ghost_aperture_filename
  );
  filename = config.pathtracer_filename;
}